

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinAnalytic_fp.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  char *funcname;
  FILE *__stream;
  undefined8 *returnvalue;
  void *kmem;
  sunrealtype *data;
  long nfe;
  long nni;
  FILE *infofp;
  N_Vector scale;
  N_Vector u;
  UserOpt uopt;
  int retval;
  SUNContext sunctx;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  char ***in_stack_ffffffffffffffa0;
  int *in_stack_ffffffffffffffa8;
  sunrealtype in_stack_ffffffffffffffb0;
  N_Vector in_stack_ffffffffffffffb8;
  undefined8 local_18 [2];
  int local_4;
  
  local_4 = 0;
  SetDefaults((UserOpt *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  iVar1 = check_retval(in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
                       in_stack_ffffffffffffff9c);
  if (iVar1 == 0) {
    ReadInputs(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
               (UserOpt)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    iVar1 = check_retval(in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
                         in_stack_ffffffffffffff9c);
    if (iVar1 == 0) {
      printf("Solve the nonlinear system:\n");
      printf("    3x - cos((y-1)z) - 1/2 = 0\n");
      printf("    x^2 - 81(y-0.9)^2 + sin(z) + 1.06 = 0\n");
      printf("    exp(-x(y-1)) + 20z + (10 pi - 3)/3 = 0\n");
      printf("Analytic solution:\n");
      printf("    x = %g\n",0x3fe0000000000000);
      printf("    y = %g\n",0x3ff0000000000000);
      printf("    z = %g\n",0xbfe0c152382d7370);
      printf("Solution method: Anderson accelerated fixed point iteration.\n");
      printf("    tolerance    = %g\n",uRam0000000000000000);
      printf("    max iters    = %ld\n",uRam0000000000000008);
      printf("    m_aa         = %ld\n",lRam0000000000000010);
      printf("    delay_aa     = %ld\n",uRam0000000000000018);
      printf("    damping_aa   = %g\n",uRam0000000000000030);
      printf("    damping_fp   = %g\n",uRam0000000000000028);
      printf("    orth routine = %d\n",(ulong)uRam0000000000000020);
      SUNContext_Create(0,local_18);
      iVar1 = check_retval(in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
                           in_stack_ffffffffffffff9c);
      if (iVar1 == 0) {
        uVar2 = N_VNew_Serial(3,local_18[0]);
        iVar1 = check_retval(in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
                             in_stack_ffffffffffffff9c);
        if (iVar1 == 0) {
          uVar3 = N_VClone(uVar2);
          iVar1 = check_retval(in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
                               in_stack_ffffffffffffff9c);
          if (iVar1 == 0) {
            funcname = (char *)KINCreate(local_18[0]);
            iVar1 = check_retval(in_stack_ffffffffffffffa8,funcname,in_stack_ffffffffffffff9c);
            if (iVar1 == 0) {
              KINSetMAA(funcname,lRam0000000000000010);
              KINSetOrthAA(funcname,uRam0000000000000020);
              iVar1 = check_retval(in_stack_ffffffffffffffa8,funcname,in_stack_ffffffffffffff9c);
              if (iVar1 == 0) {
                KINInit(funcname,FPFunction,uVar2);
                iVar1 = check_retval(in_stack_ffffffffffffffa8,funcname,in_stack_ffffffffffffff9c);
                if (iVar1 == 0) {
                  KINSetFuncNormTol(uRam0000000000000000,funcname);
                  iVar1 = check_retval(in_stack_ffffffffffffffa8,funcname,in_stack_ffffffffffffff9c)
                  ;
                  if (iVar1 == 0) {
                    KINSetNumMaxIters(funcname,uRam0000000000000008);
                    iVar1 = check_retval(in_stack_ffffffffffffffa8,funcname,
                                         in_stack_ffffffffffffff9c);
                    if (iVar1 == 0) {
                      if (lRam0000000000000010 == 0) {
                        KINSetDamping(uRam0000000000000028,funcname);
                      }
                      if (0 < lRam0000000000000010) {
                        KINSetDampingAA(uRam0000000000000030,funcname);
                        iVar1 = check_retval(in_stack_ffffffffffffffa8,funcname,
                                             in_stack_ffffffffffffff9c);
                        if (iVar1 != 0) {
                          return 1;
                        }
                        KINSetDelayAA(funcname,uRam0000000000000018);
                        iVar1 = check_retval(in_stack_ffffffffffffffa8,funcname,
                                             in_stack_ffffffffffffff9c);
                        if (iVar1 != 0) {
                          return 1;
                        }
                      }
                      __stream = fopen("kinsol.log","w");
                      iVar1 = check_retval(in_stack_ffffffffffffffa8,funcname,
                                           in_stack_ffffffffffffff9c);
                      if (iVar1 == 0) {
                        returnvalue = (undefined8 *)N_VGetArrayPointer(uVar2);
                        iVar1 = check_retval(returnvalue,funcname,in_stack_ffffffffffffff9c);
                        if (iVar1 == 0) {
                          *returnvalue = 0x3fb999999999999a;
                          returnvalue[1] = 0x3fb999999999999a;
                          returnvalue[2] = 0xbfb999999999999a;
                          N_VConst(0x3ff0000000000000,uVar3);
                          KINSol(funcname,uVar2,3,uVar3,uVar3);
                          iVar1 = check_retval(returnvalue,funcname,in_stack_ffffffffffffff9c);
                          if (iVar1 == 0) {
                            KINGetNumNonlinSolvIters(funcname,&stack0xffffffffffffffb8);
                            check_retval(returnvalue,funcname,in_stack_ffffffffffffff9c);
                            KINGetNumFuncEvals(funcname,&stack0xffffffffffffffb0);
                            check_retval(returnvalue,funcname,in_stack_ffffffffffffff9c);
                            printf("\nFinal Statistics:\n");
                            printf("Number of nonlinear iterations: %6ld\n",
                                   in_stack_ffffffffffffffb8);
                            printf("Number of function evaluations: %6ld\n",
                                   in_stack_ffffffffffffffb0);
                            iVar1 = check_ans(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
                            fclose(__stream);
                            N_VDestroy(uVar2);
                            N_VDestroy(uVar3);
                            KINFree(&stack0xffffffffffffffa0);
                            free((void *)0x0);
                            SUNContext_Free(local_18);
                            local_4 = iVar1;
                          }
                          else {
                            local_4 = 1;
                          }
                        }
                        else {
                          local_4 = 1;
                        }
                      }
                      else {
                        local_4 = 1;
                      }
                    }
                    else {
                      local_4 = 1;
                    }
                  }
                  else {
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      free((void *)0x0);
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char* argv[])
{
  SUNContext sunctx;
  int retval     = 0;    /* return value flag   */
  UserOpt uopt   = NULL; /* user options struct */
  N_Vector u     = NULL; /* solution vector     */
  N_Vector scale = NULL; /* scaling vector      */
  FILE* infofp   = NULL; /* KINSOL log file     */
  long int nni, nfe;     /* solver outputs      */
  sunrealtype* data;     /* vector data array   */
  void* kmem;            /* KINSOL memory       */

  /* Set default options */
  retval = SetDefaults(&uopt);
  if (check_retval(&retval, "SetDefaults", 1)) { return (1); }

  retval = ReadInputs(&argc, &argv, uopt);
  if (check_retval(&retval, "ReadInputs", 1))
  {
    free(uopt);
    return (1);
  }

  /* -------------------------
   * Print problem description
   * ------------------------- */

  printf("Solve the nonlinear system:\n");
  printf("    3x - cos((y-1)z) - 1/2 = 0\n");
  printf("    x^2 - 81(y-0.9)^2 + sin(z) + 1.06 = 0\n");
  printf("    exp(-x(y-1)) + 20z + (10 pi - 3)/3 = 0\n");
  printf("Analytic solution:\n");
  printf("    x = %" GSYM "\n", XTRUE);
  printf("    y = %" GSYM "\n", YTRUE);
  printf("    z = %" GSYM "\n", ZTRUE);
  printf("Solution method: Anderson accelerated fixed point iteration.\n");
  printf("    tolerance    = %" GSYM "\n", uopt->tol);
  printf("    max iters    = %ld\n", uopt->maxiter);
  printf("    m_aa         = %ld\n", uopt->m_aa);
  printf("    delay_aa     = %ld\n", uopt->delay_aa);
  printf("    damping_aa   = %" GSYM "\n", uopt->damping_aa);
  printf("    damping_fp   = %" GSYM "\n", uopt->damping_fp);
  printf("    orth routine = %d\n", uopt->orth_aa);

  /* Create the SUNDIALS context that all SUNDIALS objects require */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* --------------------------------------
   * Create vectors for solution and scales
   * -------------------------------------- */

  u = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)u, "N_VNew_Serial", 0)) { return (1); }

  scale = N_VClone(u);
  if (check_retval((void*)scale, "N_VClone", 0)) { return (1); }

  /* -----------------------------------------
   * Initialize and allocate memory for KINSOL
   * ----------------------------------------- */

  kmem = KINCreate(sunctx);
  if (check_retval((void*)kmem, "KINCreate", 0)) { return (1); }

  /* Set number of prior residuals used in Anderson acceleration */
  retval = KINSetMAA(kmem, uopt->m_aa);

  /* Set orthogonalization routine used in Anderson acceleration */
  retval = KINSetOrthAA(kmem, uopt->orth_aa);
  if (check_retval(&retval, "KINSetOrthAA", 1)) { return (1); }

  retval = KINInit(kmem, FPFunction, u);
  if (check_retval(&retval, "KINInit", 1)) { return (1); }

  /* -------------------
   * Set optional inputs
   * ------------------- */

  /* Specify stopping tolerance based on residual */
  retval = KINSetFuncNormTol(kmem, uopt->tol);
  if (check_retval(&retval, "KINSetFuncNormTol", 1)) { return (1); }

  /* Set maximum number of iterations */
  retval = KINSetNumMaxIters(kmem, uopt->maxiter);
  if (check_retval(&retval, "KINSetNumMaxItersFuncNormTol", 1)) { return (1); }

  /* Set Fixed point damping parameter */
  if (uopt->m_aa == 0) { retval = KINSetDamping(kmem, uopt->damping_fp); }

  /* Set Anderson acceleration options */
  if (uopt->m_aa > 0)
  {
    /* Set damping parameter */
    retval = KINSetDampingAA(kmem, uopt->damping_aa);
    if (check_retval(&retval, "KINSetDampingAA", 1)) { return (1); }

    /* Set acceleration delay */
    retval = KINSetDelayAA(kmem, uopt->delay_aa);
    if (check_retval(&retval, "KINSetDelayAA", 1)) { return (1); }
  }

  /* Set info log file and print level */
  infofp = fopen("kinsol.log", "w");
  if (check_retval((void*)infofp, "fopen", 0)) { return (1); }

  /* -------------
   * Initial guess
   * ------------- */

  /* Get vector data array */
  data = N_VGetArrayPointer(u);
  if (check_retval((void*)data, "N_VGetArrayPointer", 0)) { return (1); }

  data[0] = PTONE;
  data[1] = PTONE;
  data[2] = -PTONE;

  /* ----------------------------
   * Call KINSol to solve problem
   * ---------------------------- */

  /* No scaling used */
  N_VConst(ONE, scale);

  /* Call main solver */
  retval = KINSol(kmem,   /* KINSol memory block */
                  u,      /* initial guess on input; solution vector */
                  KIN_FP, /* global strategy choice */
                  scale,  /* scaling vector, for the variable cc */
                  scale); /* scaling vector for function values fval */
  if (check_retval(&retval, "KINSol", 1)) { return (1); }

  /* ------------------------------------
   * Get solver statistics
   * ------------------------------------ */

  /* get solver stats */
  retval = KINGetNumNonlinSolvIters(kmem, &nni);
  check_retval(&retval, "KINGetNumNonlinSolvIters", 1);

  retval = KINGetNumFuncEvals(kmem, &nfe);
  check_retval(&retval, "KINGetNumFuncEvals", 1);

  printf("\nFinal Statistics:\n");
  printf("Number of nonlinear iterations: %6ld\n", nni);
  printf("Number of function evaluations: %6ld\n", nfe);

  /* ------------------------------------
   * Print solution and check error
   * ------------------------------------ */

  /* check solution */
  retval = check_ans(u, uopt->tol);

  /* -----------
   * Free memory
   * ----------- */

  fclose(infofp);
  N_VDestroy(u);
  N_VDestroy(scale);
  KINFree(&kmem);
  free(uopt);
  SUNContext_Free(&sunctx);

  return (retval);
}